

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Expression * andE(void)

{
  TokenType TVar1;
  int iVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  char *local_38;
  Expression **local_30;
  undefined8 local_28;
  undefined8 local_20;
  Expression *logic;
  Expression *expr;
  
  logic = equality();
  while( true ) {
    TVar1 = peek();
    if (TVar1 != TOKEN_AND) break;
    pEVar3 = newExpression();
    pEVar3->type = EXPR_LOGICAL;
    iVar2 = presentLine();
    (pEVar3->field_1).binary.line = iVar2;
    advance();
    (pEVar3->field_1).arrayExpression.identifier = local_38;
    (pEVar3->field_1).callExpression.arguments = local_30;
    *(undefined8 *)((long)&pEVar3->field_1 + 0x20) = local_28;
    *(undefined8 *)((long)&pEVar3->field_1 + 0x28) = local_20;
    (pEVar3->field_1).binary.left = logic;
    pEVar4 = equality();
    (pEVar3->field_1).binary.right = pEVar4;
    logic = pEVar3;
  }
  return logic;
}

Assistant:

static Expression* andE(){
    Expression* expr = equality();
    while(peek() == TOKEN_AND){
        Expression* logic = newExpression();
        logic->type = EXPR_LOGICAL;
        logic->logical.line = presentLine();
        logic->logical.op = advance();
        logic->logical.left = expr;
        logic->logical.right = equality();
        expr = logic;
    }
    return expr;
}